

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
                    *this)

{
  sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
  *psVar1;
  sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
  *this_local;
  
  std::
  allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  ::allocator((allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
               *)this);
  psVar1 = empty_default_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                     ();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  fibonacci_hash_policy::fibonacci_hash_policy(&this->hash_policy);
  this->max_lookups = '\x03';
  this->_max_load_factor = 0.5;
  this->num_elements = 0;
  return;
}

Assistant:

sherwood_v3_table()
    {
    }